

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EffectManager.cpp
# Opt level: O1

unique_ptr<EffectManager,_std::default_delete<EffectManager>_> EffectManager::create(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  *this;
  long lVar3;
  __uniq_ptr_data<EffectManager,_std::default_delete<EffectManager>,_true,_true> in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>
  __l;
  EffectMap_t effects;
  allocator_type local_11a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_119;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  local_e8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined8 *local_98;
  undefined8 *local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined8 *local_68;
  undefined8 *local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined8 *local_38;
  undefined8 *local_30;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0019fdc0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__EffectLauncherInterface_0019fe10;
  local_e8.first._M_dataplus._M_p = (pointer)&local_e8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"lr","");
  local_e8.second.
  super___shared_ptr<EffectManager::EffectLauncherInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  local_e8.second.
  super___shared_ptr<EffectManager::EffectLauncherInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_0019fe60;
  puVar2[2] = &PTR__EffectLauncherInterface_0019feb0;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"rl","");
  local_98 = puVar2 + 2;
  local_90 = puVar2;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_0019fef0;
  puVar2[2] = &PTR__EffectLauncherInterface_0019ff40;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"nf","");
  local_68 = puVar2 + 2;
  local_60 = puVar2;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_0019ff80;
  puVar2[2] = &PTR__EffectLauncherInterface_0019ffd0;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"fn","");
  local_38 = puVar2 + 2;
  __l._M_len = 4;
  __l._M_array = &local_e8;
  local_30 = puVar2;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
         *)&local_118,__l,&local_119,&local_11a);
  lVar3 = 0;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_30 + lVar3) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_30 + lVar3));
    }
    if ((void *)((long)local_48 + lVar3) != *(void **)((long)local_58 + lVar3)) {
      operator_delete(*(void **)((long)local_58 + lVar3),*(long *)((long)local_48 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0xc0);
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
          *)operator_new(0x30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  ::_Rb_tree(this,&local_118);
  *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
    **)in_RDI.super___uniq_ptr_impl<EffectManager,_std::default_delete<EffectManager>_>._M_t.
       super__Tuple_impl<0UL,_EffectManager_*,_std::default_delete<EffectManager>_>.
       super__Head_base<0UL,_EffectManager_*,_false>._M_head_impl = this;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  ::~_Rb_tree(&local_118);
  return (__uniq_ptr_data<EffectManager,_std::default_delete<EffectManager>,_true,_true>)
         (tuple<EffectManager_*,_std::default_delete<EffectManager>_>)
         in_RDI.super___uniq_ptr_impl<EffectManager,_std::default_delete<EffectManager>_>._M_t.
         super__Tuple_impl<0UL,_EffectManager_*,_std::default_delete<EffectManager>_>.
         super__Head_base<0UL,_EffectManager_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<EffectManager> EffectManager::create() 
{
	EffectMap_t effects = 
	{
		{"lr", std::make_shared<EffectLauncher<LREffect>>()},
		{"rl", std::make_shared<EffectLauncher<RLEffect>>()},
		{"nf", std::make_shared<EffectLauncher<NFEffect>>()},
		{"fn", std::make_shared<EffectLauncher<FNEffect>>()},
	};

	auto mgt = new EffectManager(effects);
	if (!mgt) 
	{
		return nullptr;
	}

	return std::unique_ptr<EffectManager>(std::move(mgt));
}